

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_mtree.c
# Opt level: O0

int archive_write_mtree_header(archive_write *a,archive_entry *entry)

{
  mode_t mVar1;
  int iVar2;
  size_t sVar3;
  int r2;
  int r;
  mtree_entry_conflict *mtree_entry;
  mtree_writer *mtree;
  archive_entry *entry_local;
  archive_write *a_local;
  
  mtree_entry = (mtree_entry_conflict *)a->format_data;
  mtree = (mtree_writer *)entry;
  entry_local = (archive_entry *)a;
  if ((int)(mtree_entry->pathname).length != 0) {
    *(undefined4 *)&(mtree_entry->pathname).length = 0;
    archive_strcat((archive_string *)&(mtree_entry->basename).length,"#mtree\n");
    if ((mtree_entry->fflags_clear & 0x380238) == 0) {
      *(undefined4 *)((long)&mtree_entry->rdevmajor + 4) = 0;
    }
  }
  sVar3 = archive_entry_size((archive_entry *)mtree);
  (mtree_entry->pathname).buffer_length = sVar3;
  if ((*(int *)((long)&mtree_entry->fflags_clear + 4) == 0) ||
     (mVar1 = archive_entry_filetype((archive_entry *)mtree), mVar1 == 0x4000)) {
    iVar2 = mtree_entry_new((archive_write *)entry_local,(archive_entry *)mtree,
                            (mtree_entry_conflict **)&r2);
    a_local._4_4_ = iVar2;
    if (-0x15 < iVar2) {
      iVar2 = mtree_entry_tree_add((archive_write *)entry_local,(mtree_entry_conflict **)&r2);
      if (iVar2 < -0x14) {
        mtree_entry_free(_r2);
        a_local._4_4_ = iVar2;
      }
      else {
        (mtree_entry->rbnode).rb_nodes[0] = &_r2->rbnode;
        if (_r2->reg_info != (reg_info *)0x0) {
          sum_init((mtree_writer *)mtree_entry);
        }
      }
    }
  }
  else {
    a_local._4_4_ = 0;
  }
  return a_local._4_4_;
}

Assistant:

static int
archive_write_mtree_header(struct archive_write *a,
    struct archive_entry *entry)
{
	struct mtree_writer *mtree= a->format_data;
	struct mtree_entry *mtree_entry;
	int r, r2;

	if (mtree->first) {
		mtree->first = 0;
		archive_strcat(&mtree->buf, "#mtree\n");
		if ((mtree->keys & SET_KEYS) == 0)
			mtree->output_global_set = 0;/* Disabled. */
	}

	mtree->entry_bytes_remaining = archive_entry_size(entry);

	/* While directory only mode, we do not handle non directory files. */
	if (mtree->dironly && archive_entry_filetype(entry) != AE_IFDIR)
		return (ARCHIVE_OK);

	r2 = mtree_entry_new(a, entry, &mtree_entry);
	if (r2 < ARCHIVE_WARN)
		return (r2);
	r = mtree_entry_tree_add(a, &mtree_entry);
	if (r < ARCHIVE_WARN) {
		mtree_entry_free(mtree_entry);
		return (r);
	}
	mtree->mtree_entry = mtree_entry;

	/* If the current file is a regular file, we have to
	 * compute the sum of its content.
	 * Initialize a bunch of sum check context. */
	if (mtree_entry->reg_info)
		sum_init(mtree);

	return (r2);
}